

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
proto2_unittest::TestMapLite::_InternalSerialize
          (TestMapLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  int *piVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  bool *key;
  void *data;
  unique_ptr<const_void_*[],_std::default_delete<const_void_*[]>_> uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  undefined8 *puVar11;
  MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  if (*(int *)&this->field_0 != 0) {
    if ((*(int *)&this->field_0 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 8);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 4)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x10) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c8dea:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                 ::InternalSerialize(1,(int *)(plVar10 + 1),(int *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 4) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x10) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c8dea;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&local_40,
                 (Map<int,_int> *)&(this->field_0)._impl_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                   .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                            lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                   ::InternalSerialize(1,piVar2,piVar2 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if ((_Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl != (void **)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x20);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x28);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0x24)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x30) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c8ecd:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
                 ::InternalSerialize(2,plVar10 + 1,plVar10 + 2,target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x24) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x30) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c8ecd;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&local_40,
                 (Map<long,_long> *)&(this->field_0)._impl_.map_int64_int64_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          plVar10 = *(long **)((long)((long)uVar5._M_t.
                                            super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                            .super__Head_base<0UL,_const_void_**,_false>.
                                            _M_head_impl + 8) + lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)3>
                   ::InternalSerialize(2,plVar10,plVar10 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x40);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x48);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0x44)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x50) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c8fb0:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
                 ::InternalSerialize(3,(uint *)(plVar10 + 1),(uint *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x44) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x50) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c8fb0;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)&local_40
                      ,(Map<unsigned_int,_unsigned_int> *)&(this->field_0)._impl_.map_uint32_uint32_
                     );
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          puVar3 = *(uint **)((long)uVar5._M_t.
                                    super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                    .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                             lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)13>
                   ::InternalSerialize(3,puVar3,puVar3 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x60);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x68);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 100)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x70) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9099:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
                 ::InternalSerialize(4,(unsigned_long *)(plVar10 + 1),(unsigned_long *)(plVar10 + 2)
                                     ,target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 100) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x70) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9099;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&local_40,
                 (Map<unsigned_long,_unsigned_long> *)&(this->field_0)._impl_.map_uint64_uint64_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          puVar4 = *(unsigned_long **)
                    ((long)((long)uVar5._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl + 8) +
                    lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
                   ::InternalSerialize(4,puVar4,puVar4 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x80);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x88);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0x84)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x90) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9198:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
                 ::InternalSerialize(5,(int *)(plVar10 + 1),(int *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x84) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x90) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9198;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&local_40,
                 (Map<int,_int> *)&(this->field_0)._impl_.map_sint32_sint32_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                   .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                            lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)17,_(google::protobuf::internal::WireFormatLite::FieldType)17>
                   ::InternalSerialize(5,piVar2,piVar2 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if ((_Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl != (void **)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xa0);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0xa8);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0xa4)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0xb0) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9297:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
                 ::InternalSerialize(6,plVar10 + 1,plVar10 + 2,target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0xa4) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0xb0) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9297;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&local_40,
                 (Map<long,_long> *)&(this->field_0)._impl_.map_sint64_sint64_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          plVar10 = *(long **)((long)uVar5._M_t.
                                     super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                     .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                              lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)18,_(google::protobuf::internal::WireFormatLite::FieldType)18>
                   ::InternalSerialize(6,plVar10,plVar10 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xc0);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 200);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0xc4)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0xd0) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9396:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
                 ::InternalSerialize(7,(uint *)(plVar10 + 1),(uint *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0xc4) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0xd0) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9396;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<unsigned_int,_unsigned_int>_> *)&local_40
                      ,(Map<unsigned_int,_unsigned_int> *)
                       &(this->field_0)._impl_.map_fixed32_fixed32_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          puVar3 = *(uint **)((long)uVar5._M_t.
                                    super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                    .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                             lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<unsigned_int,_unsigned_int,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)7>
                   ::InternalSerialize(7,puVar3,puVar3 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0xe0);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0xe8);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0xe4)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0xf0) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9495:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
                 ::InternalSerialize(8,(unsigned_long *)(plVar10 + 1),(unsigned_long *)(plVar10 + 2)
                                     ,target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0xe4) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0xf0) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9495;
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<unsigned_long,_unsigned_long>_> *)&local_40,
                 (Map<unsigned_long,_unsigned_long> *)&(this->field_0)._impl_.map_fixed64_fixed64_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          puVar4 = *(unsigned_long **)
                    ((long)((long)uVar5._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl + 8) +
                    lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)6,_(google::protobuf::internal::WireFormatLite::FieldType)6>
                   ::InternalSerialize(8,puVar4,puVar4 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x100);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x108);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0x104)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x110) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9594:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
                 ::InternalSerialize(9,(int *)(plVar10 + 1),(int *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x104) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x110) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9594;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&local_40,
                 (Map<int,_int> *)&(this->field_0)._impl_.map_sfixed32_sfixed32_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                   .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                            lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)15,_(google::protobuf::internal::WireFormatLite::FieldType)15>
                   ::InternalSerialize(9,piVar2,piVar2 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if ((_Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl != (void **)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x120);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x128);
      uVar9 = (ulong)uVar7;
      if (uVar7 == *(uint *)((long)&this->field_0 + 0x124)) {
        uVar9 = 0;
        plVar10 = (long *)0x0;
      }
      else {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x130) + uVar9 * 8);
        if (plVar10 == (long *)0x0) goto LAB_001c9e92;
      }
LAB_001c9693:
      if (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
                 ::InternalSerialize(10,plVar10 + 1,plVar10 + 2,target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x124) <= uVar7) {
              plVar10 = (long *)0x0;
              uVar9 = 0;
              break;
            }
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x130) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
        goto LAB_001c9693;
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<long,_long>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<long,_long>_> *)&local_40,
                 (Map<long,_long> *)&(this->field_0)._impl_.map_sfixed64_sfixed64_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          plVar10 = *(long **)((long)((long)uVar5._M_t.
                                            super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                            .super__Head_base<0UL,_const_void_**,_false>.
                                            _M_head_impl + 8) + lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<long,_long,_(google::protobuf::internal::WireFormatLite::FieldType)16,_(google::protobuf::internal::WireFormatLite::FieldType)16>
                   ::InternalSerialize(10,plVar10,plVar10 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if ((_Head_base<0UL,_const_void_**,_false>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (_Head_base<0UL,_const_void_**,_false>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x140);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x148);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x144)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x150) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9aa0;
        goto LAB_001c9e92;
      }
LAB_001c9a9a:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9aa0:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
                 ::InternalSerialize(0xb,(int *)(plVar10 + 1),(float *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x144) <= uVar7) goto LAB_001c9a9a;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x150) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_float>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_float>_> *)&local_40,
                 (Map<int,_float> *)&(this->field_0)._impl_.map_int32_float_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                   .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                            lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_float,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)2>
                   ::InternalSerialize(0xb,piVar2,(float *)(piVar2 + 1),target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x160);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x168);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x164)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x170) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9b0b;
        goto LAB_001c9e92;
      }
LAB_001c9b05:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9b0b:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                 ::InternalSerialize(0xc,(int *)(plVar10 + 1),(double *)(plVar10 + 2),target,stream)
        ;
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x164) <= uVar7) goto LAB_001c9b05;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x170) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_double>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_double>_> *)&local_40,
                 (Map<int,_double> *)&(this->field_0)._impl_.map_int32_double_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)((long)uVar5._M_t.
                                          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                          .super__Head_base<0UL,_const_void_**,_false>._M_head_impl
                                   + 8) + lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_double,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)1>
                   ::InternalSerialize(0xc,piVar2,(double *)(piVar2 + 2),target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x180);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x188);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x184)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 400) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9b76;
        goto LAB_001c9e92;
      }
LAB_001c9b70:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9b76:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
                 ::InternalSerialize(0xd,(bool *)(plVar10 + 1),(bool *)((long)plVar10 + 9),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x184) <= uVar7) goto LAB_001c9b70;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 400) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<bool,_bool>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<bool,_bool>_> *)&local_40,
                 (Map<bool,_bool> *)&(this->field_0)._impl_.map_bool_bool_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          key = *(bool **)((long)uVar5._M_t.
                                 super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                 .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                          lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<bool,_bool,_(google::protobuf::internal::WireFormatLite::FieldType)8,_(google::protobuf::internal::WireFormatLite::FieldType)8>
                   ::InternalSerialize(0xd,key,key + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if ((_Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl != (void **)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x1a0);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x1a8);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x1a4)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x1b0) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9be1;
        goto LAB_001c9e92;
      }
LAB_001c9bdb:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9be1:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                 ::InternalSerialize(0xe,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(plVar10 + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(plVar10 + 5),target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x1a4) <= uVar7) goto LAB_001c9bdb;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x1b0) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::
      MapSorterPtr<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterPtr(&local_40,
                     (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&(this->field_0)._impl_.map_string_string_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 3;
        lVar6 = 0;
        do {
          target = google::protobuf::internal::
                   MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                   ::InternalSerialize(0xe,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             **)((long)uVar5._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                                  .super__Head_base<0UL,_const_void_**,_false>.
                                                  _M_head_impl + lVar6),
                                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         **)((long)uVar5._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                                  .super__Head_base<0UL,_const_void_**,_false>.
                                                  _M_head_impl + lVar6) + 1,target,stream);
          lVar6 = lVar6 + 8;
        } while (lVar8 != lVar6);
      }
      if ((_Head_base<0UL,_const_void_**,_false>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (_Head_base<0UL,_const_void_**,_false>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x1c0);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x1c8);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x1c4)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x1d0) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9c4c;
        goto LAB_001c9e92;
      }
LAB_001c9c46:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9c4c:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                 ::InternalSerialize(0xf,(int *)(plVar10 + 1),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(plVar10 + 2),target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x1c4) <= uVar7) goto LAB_001c9c46;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x1d0) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::MapSorterFlat((MapSorterFlat<google::protobuf::Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_40,
                      (Map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&(this->field_0)._impl_.map_int32_bytes_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                   .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                            lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
                   ::InternalSerialize(0xf,piVar2,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(piVar2 + 2),target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x1e0);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x1e8);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x1e4)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x1f0) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9cb7;
        goto LAB_001c9e92;
      }
LAB_001c9cb1:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9cb7:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_proto2_unittest::MapEnumLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
                 ::InternalSerialize(0x10,(int *)(plVar10 + 1),(MapEnumLite *)((long)plVar10 + 0xc),
                                     target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x1e4) <= uVar7) goto LAB_001c9cb1;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x1f0) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::MapEnumLite>_> *)
                 &local_40,
                 (Map<int,_proto2_unittest::MapEnumLite> *)&(this->field_0)._impl_.map_int32_enum_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)((long)uVar5._M_t.
                                          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                          .super__Head_base<0UL,_const_void_**,_false>._M_head_impl
                                   + 8) + lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_proto2_unittest::MapEnumLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
                   ::InternalSerialize(0x10,piVar2,(MapEnumLite *)(piVar2 + 1),target,stream);
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if (local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (__uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x200);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x208);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x204)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x210) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9d22;
        goto LAB_001c9e92;
      }
LAB_001c9d1c:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9d22:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_proto2_unittest::ForeignMessageLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 ::InternalSerialize(0x11,(int *)(plVar10 + 1),(ForeignMessageLite *)(plVar10 + 2),
                                     target,stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x204) <= uVar7) goto LAB_001c9d1c;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x210) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::
      MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_proto2_unittest::ForeignMessageLite>_> *)
                 &local_40,
                 (Map<int,_proto2_unittest::ForeignMessageLite> *)
                 &(this->field_0)._impl_.map_int32_foreign_message_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           (__uniq_ptr_data<const_void_*,_std::default_delete<const_void_*[]>,_true,_true>)
           local_40.items_;
      if (local_40.size_ != 0) {
        lVar8 = local_40.size_ << 4;
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)uVar5._M_t.
                                   super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                   .super__Head_base<0UL,_const_void_**,_false>._M_head_impl +
                            lVar6 + 8);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_proto2_unittest::ForeignMessageLite,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                   ::InternalSerialize(0x11,piVar2,(ForeignMessageLite *)(piVar2 + 2),target,stream)
          ;
          lVar6 = lVar6 + 0x10;
        } while (lVar8 != lVar6);
      }
      if ((_Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl != (void **)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  iVar1 = *(int *)((long)&this->field_0 + 0x220);
  if (iVar1 != 0) {
    if ((iVar1 == 1) || (stream->is_serialization_deterministic_ == false)) {
      uVar7 = *(uint *)((long)&this->field_0 + 0x228);
      uVar9 = (ulong)uVar7;
      if (uVar7 != *(uint *)((long)&this->field_0 + 0x224)) {
        plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x230) + uVar9 * 8);
        if (plVar10 != (long *)0x0) goto LAB_001c9d8d;
LAB_001c9e92:
        google::protobuf::internal::protobuf_assumption_failed
                  ("node != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                   ,0x22e);
      }
LAB_001c9d87:
      uVar9 = 0;
      plVar10 = (long *)0x0;
LAB_001c9d8d:
      while (plVar10 != (long *)0x0) {
        target = google::protobuf::internal::
                 MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                 ::InternalSerialize(0x12,(int *)(plVar10 + 1),(int *)((long)plVar10 + 0xc),target,
                                     stream);
        plVar10 = (long *)*plVar10;
        if (plVar10 == (long *)0x0) {
          do {
            uVar7 = (int)uVar9 + 1;
            uVar9 = (ulong)uVar7;
            if (*(uint *)((long)&this->field_0 + 0x224) <= uVar7) goto LAB_001c9d87;
            plVar10 = *(long **)(*(long *)((long)&this->field_0 + 0x230) + (ulong)uVar7 * 8);
          } while (plVar10 == (long *)0x0);
        }
      }
    }
    else {
      google::protobuf::internal::MapSorterFlat<google::protobuf::Map<int,_int>_>::MapSorterFlat
                ((MapSorterFlat<google::protobuf::Map<int,_int>_> *)&local_40,
                 (Map<int,_int> *)&(this->field_0)._impl_.teboring_);
      uVar5._M_t.super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
      super__Head_base<0UL,_const_void_**,_false>._M_head_impl =
           local_40.items_._M_t.
           super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
           super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
           super__Head_base<0UL,_const_void_**,_false>._M_head_impl;
      if (local_40.size_ != 0) {
        lVar6 = 0;
        do {
          piVar2 = *(int **)((long)((long)uVar5._M_t.
                                          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                          .super__Head_base<0UL,_const_void_**,_false>._M_head_impl
                                   + 8) + lVar6);
          target = google::protobuf::internal::
                   MapEntryFuncs<int,_int,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)5>
                   ::InternalSerialize(0x12,piVar2,piVar2 + 1,target,stream);
          lVar6 = lVar6 + 0x10;
        } while (local_40.size_ << 4 != lVar6);
      }
      if ((tuple<const_void_**,_std::default_delete<const_void_*[]>_>)
          local_40.items_._M_t.
          super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>.
          super__Head_base<0UL,_const_void_**,_false>._M_head_impl !=
          (_Head_base<0UL,_const_void_**,_false>)0x0) {
        operator_delete__((void *)local_40.items_._M_t.
                                  super___uniq_ptr_impl<const_void_*,_std::default_delete<const_void_*[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_const_void_**,_std::default_delete<const_void_*[]>_>
                                  .super__Head_base<0UL,_const_void_**,_false>._M_head_impl);
      }
    }
  }
  uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar9 & 1) != 0) {
    data = *(void **)((uVar9 & 0xfffffffffffffffe) + 8);
    uVar9 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar9 & 1) == 0) {
      puVar11 = &google::protobuf::internal::fixed_address_empty_string;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar11 = (undefined8 *)((uVar9 & 0xfffffffffffffffe) + 8);
    }
    uVar7 = *(uint *)(puVar11 + 1);
    if ((long)stream->end_ - (long)target < (long)(int)uVar7) {
      target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,uVar7,target)
      ;
    }
    else {
      memcpy(target,data,(ulong)uVar7);
      target = target + (int)uVar7;
    }
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestMapLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestMapLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestMapLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // map<int32, int32> map_int32_int32 = 1;
  if (!this_._internal_map_int32_int32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_INT32>;
    const auto& field = this_._internal_map_int32_int32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            1, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int64, int64> map_int64_int64 = 2;
  if (!this_._internal_map_int64_int64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_INT64,
                                   _pbi::WireFormatLite::TYPE_INT64>;
    const auto& field = this_._internal_map_int64_int64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            2, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<uint32, uint32> map_uint32_uint32 = 3;
  if (!this_._internal_map_uint32_uint32().empty()) {
    using MapType = ::google::protobuf::Map<::uint32_t, ::uint32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint32_t, ::uint32_t,
                                   _pbi::WireFormatLite::TYPE_UINT32,
                                   _pbi::WireFormatLite::TYPE_UINT32>;
    const auto& field = this_._internal_map_uint32_uint32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            3, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            3, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<uint64, uint64> map_uint64_uint64 = 4;
  if (!this_._internal_map_uint64_uint64().empty()) {
    using MapType = ::google::protobuf::Map<::uint64_t, ::uint64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint64_t, ::uint64_t,
                                   _pbi::WireFormatLite::TYPE_UINT64,
                                   _pbi::WireFormatLite::TYPE_UINT64>;
    const auto& field = this_._internal_map_uint64_uint64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            4, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            4, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sint32, sint32> map_sint32_sint32 = 5;
  if (!this_._internal_map_sint32_sint32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_SINT32,
                                   _pbi::WireFormatLite::TYPE_SINT32>;
    const auto& field = this_._internal_map_sint32_sint32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            5, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            5, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sint64, sint64> map_sint64_sint64 = 6;
  if (!this_._internal_map_sint64_sint64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_SINT64,
                                   _pbi::WireFormatLite::TYPE_SINT64>;
    const auto& field = this_._internal_map_sint64_sint64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            6, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            6, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<fixed32, fixed32> map_fixed32_fixed32 = 7;
  if (!this_._internal_map_fixed32_fixed32().empty()) {
    using MapType = ::google::protobuf::Map<::uint32_t, ::uint32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint32_t, ::uint32_t,
                                   _pbi::WireFormatLite::TYPE_FIXED32,
                                   _pbi::WireFormatLite::TYPE_FIXED32>;
    const auto& field = this_._internal_map_fixed32_fixed32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            7, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            7, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<fixed64, fixed64> map_fixed64_fixed64 = 8;
  if (!this_._internal_map_fixed64_fixed64().empty()) {
    using MapType = ::google::protobuf::Map<::uint64_t, ::uint64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::uint64_t, ::uint64_t,
                                   _pbi::WireFormatLite::TYPE_FIXED64,
                                   _pbi::WireFormatLite::TYPE_FIXED64>;
    const auto& field = this_._internal_map_fixed64_fixed64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            8, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            8, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sfixed32, sfixed32> map_sfixed32_sfixed32 = 9;
  if (!this_._internal_map_sfixed32_sfixed32().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_SFIXED32,
                                   _pbi::WireFormatLite::TYPE_SFIXED32>;
    const auto& field = this_._internal_map_sfixed32_sfixed32();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            9, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            9, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<sfixed64, sfixed64> map_sfixed64_sfixed64 = 10;
  if (!this_._internal_map_sfixed64_sfixed64().empty()) {
    using MapType = ::google::protobuf::Map<::int64_t, ::int64_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int64_t, ::int64_t,
                                   _pbi::WireFormatLite::TYPE_SFIXED64,
                                   _pbi::WireFormatLite::TYPE_SFIXED64>;
    const auto& field = this_._internal_map_sfixed64_sfixed64();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            10, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            10, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, float> map_int32_float = 11;
  if (!this_._internal_map_int32_float().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, float>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, float,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_FLOAT>;
    const auto& field = this_._internal_map_int32_float();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            11, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            11, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, double> map_int32_double = 12;
  if (!this_._internal_map_int32_double().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, double>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, double,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_DOUBLE>;
    const auto& field = this_._internal_map_int32_double();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            12, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            12, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<bool, bool> map_bool_bool = 13;
  if (!this_._internal_map_bool_bool().empty()) {
    using MapType = ::google::protobuf::Map<bool, bool>;
    using WireHelper = _pbi::MapEntryFuncs<bool, bool,
                                   _pbi::WireFormatLite::TYPE_BOOL,
                                   _pbi::WireFormatLite::TYPE_BOOL>;
    const auto& field = this_._internal_map_bool_bool();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            13, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            13, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<string, string> map_string_string = 14;
  if (!this_._internal_map_string_string().empty()) {
    using MapType = ::google::protobuf::Map<std::string, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<std::string, std::string,
                                   _pbi::WireFormatLite::TYPE_STRING,
                                   _pbi::WireFormatLite::TYPE_STRING>;
    const auto& field = this_._internal_map_string_string();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterPtr<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            14, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            14, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, bytes> map_int32_bytes = 15;
  if (!this_._internal_map_int32_bytes().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, std::string>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, std::string,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_BYTES>;
    const auto& field = this_._internal_map_int32_bytes();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            15, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            15, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, .proto2_unittest.MapEnumLite> map_int32_enum = 16;
  if (!this_._internal_map_int32_enum().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::proto2_unittest::MapEnumLite>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::MapEnumLite,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_ENUM>;
    const auto& field = this_._internal_map_int32_enum();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            16, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            16, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, .proto2_unittest.ForeignMessageLite> map_int32_foreign_message = 17;
  if (!this_._internal_map_int32_foreign_message().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::proto2_unittest::ForeignMessageLite>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::proto2_unittest::ForeignMessageLite,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_MESSAGE>;
    const auto& field = this_._internal_map_int32_foreign_message();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            17, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            17, entry.first, entry.second, target, stream);
      }
    }
  }

  // map<int32, int32> teboring = 18;
  if (!this_._internal_teboring().empty()) {
    using MapType = ::google::protobuf::Map<::int32_t, ::int32_t>;
    using WireHelper = _pbi::MapEntryFuncs<::int32_t, ::int32_t,
                                   _pbi::WireFormatLite::TYPE_INT32,
                                   _pbi::WireFormatLite::TYPE_INT32>;
    const auto& field = this_._internal_teboring();

    if (stream->IsSerializationDeterministic() && field.size() > 1) {
      for (const auto& entry : ::google::protobuf::internal::MapSorterFlat<MapType>(field)) {
        target = WireHelper::InternalSerialize(
            18, entry.first, entry.second, target, stream);
      }
    } else {
      for (const auto& entry : field) {
        target = WireHelper::InternalSerialize(
            18, entry.first, entry.second, target, stream);
      }
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestMapLite)
  return target;
}